

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_val_t * mpcf_strfold(int n,mpc_val_t **xs)

{
  size_t sVar1;
  void *pvVar2;
  mpc_val_t *pmVar3;
  ulong uVar4;
  long lVar5;
  
  if (n != 0) {
    if (n < 1) {
      sVar1 = 1;
    }
    else {
      uVar4 = 0;
      lVar5 = 0;
      do {
        sVar1 = strlen((char *)xs[uVar4]);
        lVar5 = lVar5 + sVar1;
        uVar4 = uVar4 + 1;
      } while ((uint)n != uVar4);
      sVar1 = lVar5 + 1;
    }
    pmVar3 = realloc(*xs,sVar1);
    *xs = pmVar3;
    if (1 < n) {
      uVar4 = 1;
      do {
        strcat((char *)*xs,(char *)xs[uVar4]);
        free(xs[uVar4]);
        uVar4 = uVar4 + 1;
      } while ((uint)n != uVar4);
      pmVar3 = *xs;
    }
    return pmVar3;
  }
  pvVar2 = calloc(1,1);
  return pvVar2;
}

Assistant:

mpc_val_t *mpcf_strfold(int n, mpc_val_t **xs) {
  int i;
  size_t l = 0;

  if (n == 0) { return calloc(1, 1); }

  for (i = 0; i < n; i++) { l += strlen(xs[i]); }

  xs[0] = realloc(xs[0], l + 1);

  for (i = 1; i < n; i++) {
    strcat(xs[0], xs[i]); free(xs[i]);
  }

  return xs[0];
}